

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

char * Json::duplicateStringValue(char *value,uint length)

{
  size_t sVar1;
  char *__dest;
  runtime_error *this;
  char *newString;
  uint length_local;
  char *value_local;
  
  newString._4_4_ = length;
  if (length == 0xffffffff) {
    sVar1 = strlen(value);
    newString._4_4_ = (uint)sVar1;
  }
  if (0x7ffffffe < newString._4_4_) {
    newString._4_4_ = 0x7ffffffe;
  }
  __dest = (char *)malloc((ulong)(newString._4_4_ + 1));
  if (__dest == (char *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Failed to allocate string value buffer");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  memcpy(__dest,value,(ulong)newString._4_4_);
  __dest[newString._4_4_] = '\0';
  return __dest;
}

Assistant:

static inline char *
duplicateStringValue( const char *value, 
                      unsigned int length = unknown )
{
   if ( length == unknown )
      length = (unsigned int)strlen(value);

   // Avoid an integer overflow in the call to malloc below by limiting length
   // to a sane value.
   if (length >= (unsigned)Value::maxInt)
      length = Value::maxInt - 1;

   char *newString = static_cast<char *>( malloc( length + 1 ) );
   JSON_ASSERT_MESSAGE( newString != 0, "Failed to allocate string value buffer" );
   memcpy( newString, value, length );
   newString[length] = 0;
   return newString;
}